

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test *this)

{
  void *pvVar1;
  Arena *pAVar2;
  string_view value;
  string_view value_00;
  string_view filename;
  FileDescriptorSet file_descriptor_set;
  string *local_110 [2];
  undefined1 local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  undefined1 local_70 [72];
  
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_70,(Arena *)0x0);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_70 + 0x28),
                      Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>);
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 200),value,pAVar2);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar1 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pAVar2 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)pAVar2 & 1) != 0) {
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  value_00._M_str = "Foo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar1 + 0xd8),value_00,pAVar2);
  filename._M_str = "foo.bin";
  filename._M_len = 7;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename,(FileDescriptorSet *)local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir --descriptor_set_in=$tmpdir/foo.bin foo.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  local_f0._M_allocated_capacity = (size_type)(string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_100 + 0x10),"test_generator","");
  local_110[0] = (string *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,anon_var_dwarf_a22956 + 5);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"foo.proto","");
  local_d0._M_allocated_capacity = (size_type)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_e0 + 0x10),"Foo","");
  CommandLineInterfaceTest::ExpectGenerated
            ((CommandLineInterfaceTest *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_dataplus._M_p,
             (string *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_string_length,(string *)local_f0._M_allocated_capacity,(string *)local_f0._8_8_,
             local_110[0]);
  if ((long *)local_d0._M_allocated_capacity != local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,local_c0[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_110[0] != (string *)local_100) {
    operator_delete(local_110[0],(ulong)(local_100._0_8_ + 1));
  }
  if ((string *)local_f0._M_allocated_capacity != (string *)local_e0) {
    operator_delete((void *)local_f0._M_allocated_capacity,(ulong)(local_e0._0_8_ + 1));
  }
  local_f0._M_allocated_capacity = (size_type)(string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_100 + 0x10),"test_plugin","");
  local_110[0] = (string *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,anon_var_dwarf_a22956 + 5);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"foo.proto","");
  local_d0._M_allocated_capacity = (size_type)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_e0 + 0x10),"Foo","");
  CommandLineInterfaceTest::ExpectGenerated
            ((CommandLineInterfaceTest *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_dataplus._M_p,
             (string *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_string_length,(string *)local_f0._M_allocated_capacity,(string *)local_f0._8_8_,
             local_110[0]);
  if ((long *)local_d0._M_allocated_capacity != local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,local_c0[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_110[0] != (string *)local_100) {
    operator_delete(local_110[0],(ulong)(local_100._0_8_ + 1));
  }
  if ((string *)local_f0._M_allocated_capacity != (string *)local_e0) {
    operator_delete((void *)local_f0._M_allocated_capacity,(ulong)(local_e0._0_8_ + 1));
  }
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_70);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GeneratorAndPlugin_DescriptorSetIn) {
  // Invoke a generator and a plugin at the same time.

  FileDescriptorSet file_descriptor_set;
  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  WriteDescriptorSet("foo.bin", &file_descriptor_set);

  Run("protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir "
      "--descriptor_set_in=$tmpdir/foo.bin foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "foo.proto", "Foo");
  ExpectGenerated("test_plugin", "", "foo.proto", "Foo");
}